

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O1

c_v128 __thiscall simd_test_avx2::c_imm_v128_shl_n_32<1>(simd_test_avx2 *this,c_v128 a)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  c_v128 cVar4;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = a.u64[0];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = this;
  auVar1 = vpunpcklqdq_avx(auVar2,auVar1);
  auVar1 = vpaddq_avx(auVar1,auVar1);
  auVar3._8_8_ = 0xfffffffefffffffe;
  auVar3._0_8_ = 0xfffffffefffffffe;
  auVar1 = vpand_avx(auVar1,auVar3);
  cVar4._8_8_ = vpextrq_avx(auVar1,1);
  cVar4.u64[0] = auVar1._0_8_;
  return cVar4;
}

Assistant:

SIMD_INLINE c_v64 c_v64_shl_32(c_v64 a, unsigned int n) {
  c_v64 t;
  if (SIMD_CHECK && n > 31) {
    fprintf(stderr, "Error: undefined u32 shift left %d\n", n);
    abort();
  }
  t.u32[1] = a.u32[1] << n;
  t.u32[0] = a.u32[0] << n;
  return t;
}